

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::ChooseConfigCase::fillDontCare
          (ChooseConfigCase *this,
          vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          *attributes)

{
  pointer ppVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int ndx;
  long lVar5;
  pair<unsigned_int,_int> local_38;
  
  lVar5 = 0;
  do {
    ppVar1 = (attributes->
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(attributes->
                  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
    if (lVar2 == 0) {
LAB_002249e8:
      local_38 = (pair<unsigned_int,_int>)
                 ((ulong)fillDontCare::dontCareAttributes[lVar5] | 0xffffffff00000000);
      std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
      emplace_back<std::pair<unsigned_int,int>>
                ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>> *)
                 attributes,&local_38);
    }
    else {
      lVar2 = lVar2 >> 3;
      lVar3 = 0;
      bVar4 = false;
      do {
        if (ppVar1[lVar3].first == fillDontCare::dontCareAttributes[lVar5]) {
          bVar4 = true;
        }
        lVar3 = lVar3 + 1;
      } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
      if (!bVar4) goto LAB_002249e8;
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 4) {
      return;
    }
  } while( true );
}

Assistant:

void fillDontCare (std::vector<std::pair<EGLenum, EGLint> >& attributes)
	{
		static const EGLenum dontCareAttributes[] =
		{
			EGL_TRANSPARENT_TYPE,
			EGL_COLOR_BUFFER_TYPE,
			EGL_RENDERABLE_TYPE,
			EGL_SURFACE_TYPE
		};

		// Fill appropriate unused attributes with EGL_DONT_CARE
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(dontCareAttributes); ndx++)
		{
			bool found = false;
			for (size_t findNdx = 0; findNdx < attributes.size(); findNdx++)
				if (attributes[findNdx].first == dontCareAttributes[ndx]) found = true;

			if (!found) attributes.push_back(std::make_pair(dontCareAttributes[ndx], EGL_DONT_CARE));
		}
	}